

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall ipx::Model::ScalePoint(Model *this,Vector *x,Vector *slack,Vector *y,Vector *z)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  double *pdVar4;
  int *piVar5;
  double *pdVar6;
  double *pdVar7;
  
  if ((this->colscale_)._M_size != 0) {
    sVar2 = x->_M_size;
    pdVar4 = (this->colscale_)._M_data;
    if (0 < (long)sVar2) {
      pdVar6 = x->_M_data;
      pdVar7 = pdVar4;
      do {
        *pdVar6 = *pdVar6 / *pdVar7;
        pdVar6 = pdVar6 + 1;
        pdVar7 = pdVar7 + 1;
      } while (pdVar7 < pdVar4 + sVar2);
    }
    if (0 < (long)z->_M_size) {
      pdVar6 = pdVar4 + z->_M_size;
      pdVar7 = z->_M_data;
      do {
        *pdVar7 = *pdVar4 * *pdVar7;
        pdVar7 = pdVar7 + 1;
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 < pdVar6);
    }
  }
  if ((this->rowscale_)._M_size != 0) {
    sVar2 = y->_M_size;
    pdVar4 = (this->rowscale_)._M_data;
    if (0 < (long)sVar2) {
      pdVar6 = y->_M_data;
      pdVar7 = pdVar4;
      do {
        *pdVar6 = *pdVar6 / *pdVar7;
        pdVar6 = pdVar6 + 1;
        pdVar7 = pdVar7 + 1;
      } while (pdVar7 < pdVar4 + sVar2);
    }
    if (0 < (long)slack->_M_size) {
      pdVar6 = pdVar4 + slack->_M_size;
      pdVar7 = slack->_M_data;
      do {
        *pdVar7 = *pdVar4 * *pdVar7;
        pdVar7 = pdVar7 + 1;
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 < pdVar6);
    }
  }
  piVar5 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar3) {
    pdVar4 = x->_M_data;
    pdVar6 = z->_M_data;
    do {
      iVar1 = *piVar5;
      pdVar4[iVar1] = -pdVar4[iVar1];
      pdVar6[iVar1] = -pdVar6[iVar1];
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar3);
  }
  return;
}

Assistant:

void Model::ScalePoint(Vector& x, Vector& slack, Vector& y, Vector& z) const {
    if (colscale_.size() > 0) {
        x /= colscale_;
        z *= colscale_;
    }
    if (rowscale_.size() > 0) {
        y /= rowscale_;
        slack *= rowscale_;
    }
    for (Int j : flipped_vars_) {
        x[j] *= -1.0;
        z[j] *= -1.0;
    }
}